

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O0

ptrdiff_t rcnb_decode_blockend(char *plaintext_out,rcnb_decodestate *state_in)

{
  _Bool _Var1;
  long *in_RSI;
  char **in_RDI;
  char *plaintext_char;
  char **ppcVar2;
  wchar_t *in_stack_fffffffffffffff8;
  long lVar3;
  
  if ((*in_RSI == 0) || (*in_RSI == 2)) {
    ppcVar2 = in_RDI;
    if ((*in_RSI != 2) || (_Var1 = rcnb_decode_byte(in_stack_fffffffffffffff8,in_RDI), _Var1)) {
      *(undefined1 *)in_RDI = 0;
      *in_RSI = 0;
      lVar3 = (long)in_RDI - (long)ppcVar2;
    }
    else {
      lVar3 = -1;
    }
  }
  else {
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

ptrdiff_t rcnb_decode_blockend(char* const plaintext_out, rcnb_decodestate* state_in)
{
    if (state_in->i != 0 && state_in->i != 2)
        return -1;
    char* plaintext_char = plaintext_out;
    if (state_in->i == 2) {
        if(!rcnb_decode_byte(state_in->trailing_code, &plaintext_char))
            return -1;
    }
    *plaintext_char = 0;
    state_in->i = 0;
    return plaintext_char - plaintext_out;
}